

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-mem-cursor.c
# Opt level: O1

int coda_mem_cursor_get_num_elements(coda_cursor_conflict *cursor,long *num_elements)

{
  coda_dynamic_type_struct *pcVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  coda_type *pcVar6;
  long lVar7;
  ulong uVar8;
  long lStack_50;
  char acStack_48 [24];
  
  pcVar1 = cursor->stack[(long)cursor->n + -1].type;
  switch(pcVar1[1].backend) {
  case coda_backend_ascii:
  case coda_backend_binary:
    *num_elements = *(long *)(pcVar1 + 2);
    break;
  case 2:
    if (pcVar1->definition->format != coda_format_ascii) {
      iVar4 = coda_bin_cursor_get_num_elements(cursor,num_elements);
      return iVar4;
    }
    pcVar6 = (coda_type *)cursor->stack[(long)cursor->n + -1].type;
    if (99 < pcVar6->format) {
      pcVar6 = *(coda_type **)&pcVar6->type_class;
    }
    if (1 < pcVar6->type_class) {
      *num_elements = 1;
      return 0;
    }
    pcVar6 = (coda_type *)cursor->stack[(long)cursor->n + -1].type;
    if (99 < pcVar6->format) {
      pcVar6 = *(coda_type **)&pcVar6->type_class;
    }
    if (pcVar6->type_class == 1) {
      pcVar5 = *(char **)&pcVar6[1].type_class;
      if (pcVar5 == (char *)0xffffffffffffffff) {
        bVar2 = 0 < *(int *)&pcVar6[1].name;
        lVar7 = 1;
        if (0 < *(int *)&pcVar6[1].name) {
          uVar8 = 0;
          do {
            if ((&pcVar6[1].description)[uVar8] == (char *)0xffffffffffffffff) {
              iVar4 = coda_expression_eval_integer
                                ((coda_expression *)(&pcVar6[2].bit_size)[uVar8],cursor,&lStack_50);
              if (iVar4 == 0) {
                if (lStack_50 < 0) {
                  coda_str64(lStack_50,acStack_48);
                  coda_set_error(-300,
                                 "product error detected (invalid array size - calculated array size = %s)"
                                 ,acStack_48);
                  goto LAB_0014f7fb;
                }
                lVar7 = lVar7 * lStack_50;
                bVar3 = true;
              }
              else {
                coda_add_error_message(" for dim[%d] expression",uVar8 & 0xffffffff);
LAB_0014f7fb:
                bVar3 = false;
                coda_cursor_add_to_error_message(cursor);
              }
              if (!bVar3) goto LAB_0014f858;
            }
            else {
              lVar7 = lVar7 * (long)(&pcVar6[1].description)[uVar8];
            }
            uVar8 = uVar8 + 1;
            bVar2 = (long)uVar8 < (long)*(int *)&pcVar6[1].name;
          } while ((long)uVar8 < (long)*(int *)&pcVar6[1].name);
        }
        *num_elements = lVar7;
LAB_0014f858:
        if (!bVar2) {
          return 0;
        }
        return -1;
      }
    }
    else {
      if (pcVar6->type_class != 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-ascbin-cursor.c"
                      ,0x343,"int coda_ascbin_cursor_get_num_elements(const coda_cursor *, long *)")
        ;
      }
      pcVar5 = pcVar6[1].name;
    }
    *num_elements = (long)pcVar5;
    return 0;
  case 3:
    *num_elements = 1;
  }
  return 0;
}

Assistant:

int coda_mem_cursor_get_num_elements(const coda_cursor *cursor, long *num_elements)
{
    coda_mem_type *type = (coda_mem_type *)cursor->stack[cursor->n - 1].type;

    switch (type->tag)
    {
        case tag_mem_record:
            *num_elements = ((coda_mem_record *)cursor->stack[cursor->n - 1].type)->num_fields;
            break;
        case tag_mem_array:
            *num_elements = ((coda_mem_array *)cursor->stack[cursor->n - 1].type)->num_elements;
            break;
        case tag_mem_data:
            if (type->definition->format == coda_format_ascii)
            {
                return coda_ascii_cursor_get_num_elements(cursor, num_elements);
            }
            return coda_bin_cursor_get_num_elements(cursor, num_elements);
        case tag_mem_special:
            *num_elements = 1;
            break;
    }
    return 0;
}